

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

bool __thiscall
chaiscript::dispatch::
Attribute_Access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::exception::eval_error>
::operator==(Attribute_Access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::exception::eval_error>
             *this,Proxy_Function_Base *t_func)

{
  if (t_func->_vptr_Proxy_Function_Base != (_func_int **)&PTR__Attribute_Access_00406618) {
    return false;
  }
  return (pointer)this->m_attr ==
         t_func[1].m_types.
         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
}

Assistant:

bool operator==(const Proxy_Function_Base &t_func) const noexcept override {
        const Attribute_Access<T, Class> *aa = dynamic_cast<const Attribute_Access<T, Class> *>(&t_func);

        if (aa) {
          return m_attr == aa->m_attr;
        } else {
          return false;
        }
      }